

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O2

Mat * IntArrayMat(Mat *__return_storage_ptr__,int a0,int a1)

{
  int *piVar1;
  
  ncnn::Mat::Mat(__return_storage_ptr__,2,4,(Allocator *)0x0);
  piVar1 = (int *)__return_storage_ptr__->data;
  *piVar1 = a0;
  piVar1[1] = a1;
  return __return_storage_ptr__;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0, int a1)
{
    ncnn::Mat m(2);
    int* p = m;
    p[0] = a0;
    p[1] = a1;
    return m;
}